

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O3

Pass * wasm::createGUFAOptimizingPass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x38);
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  pPVar1->_vptr_Pass = (_func_int **)&PTR__Pass_00d73c30;
  *(undefined1 *)&pPVar1[1]._vptr_Pass = 1;
  return pPVar1;
}

Assistant:

Pass* createGUFAOptimizingPass() { return new GUFAPass(true); }